

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# peglib.h
# Opt level: O3

u32string * __thiscall
peg::decode_abi_cxx11_(u32string *__return_storage_ptr__,peg *this,char *s8,size_t l)

{
  byte bVar1;
  byte *pbVar2;
  uint uVar3;
  ulong uVar4;
  long lVar5;
  char *pcVar6;
  char *pcVar7;
  char32_t __c;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = L'\0';
  pcVar6 = (char *)0x0;
  do {
    if (s8 <= pcVar6) {
      return __return_storage_ptr__;
    }
    pcVar7 = s8;
    if (s8 + -1 != pcVar6) {
      pcVar7 = pcVar6 + 1;
    }
    __c = L'\0';
    uVar4 = (long)pcVar7 - (long)pcVar6;
    if (pcVar7 != pcVar6) {
      pbVar2 = (byte *)(pcVar6 + (long)this);
      bVar1 = *pbVar2;
      __c = (char32_t)bVar1;
      if ((char)bVar1 < '\0') {
        uVar3 = (uint)bVar1;
        if ((__c & 0xffffffe0U) == 0xc0) {
          __c = L'\0';
          if (uVar4 != 1) {
            uVar3 = (uVar3 & 0x1f) << 6;
            lVar5 = 1;
            goto LAB_0012ca92;
          }
        }
        else if ((uVar3 & 0xfffffff0) == 0xe0) {
          __c = L'\0';
          if (2 < uVar4) {
            uVar3 = (uVar3 & 0xf) << 0xc | (pbVar2[1] & 0x3f) << 6;
            lVar5 = 2;
LAB_0012ca92:
            __c = pbVar2[lVar5] & 0x3f | uVar3;
          }
        }
        else {
          __c = L'\0';
          if (3 < uVar4 && (uVar3 & 0xfffffff8) == 0xf0) {
            uVar3 = (pbVar2[2] & 0x3f) << 6 | (pbVar2[1] & 0x3f) << 0xc | (uVar3 & 7) << 0x12;
            lVar5 = 3;
            goto LAB_0012ca92;
          }
        }
      }
    }
    std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::
    push_back(__return_storage_ptr__,__c);
    pcVar6 = pcVar7;
  } while( true );
}

Assistant:

inline std::u32string decode(const char *s8, size_t l) {
  std::u32string out;
  size_t i = 0;
  while (i < l) {
    auto beg = i++;
    while (i < l && (s8[i] & 0xc0) == 0x80) {
      i++;
    }
    out += decode_codepoint(&s8[beg], (i - beg));
  }
  return out;
}